

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O2

void __thiscall
QPropertyAnimation::QPropertyAnimation
          (QPropertyAnimation *this,QObject *target,QByteArray *propertyName,QObject *parent)

{
  QPropertyAnimationPrivate *this_00;
  
  this_00 = (QPropertyAnimationPrivate *)operator_new(0x188);
  QPropertyAnimationPrivate::QPropertyAnimationPrivate(this_00);
  QVariantAnimation::QVariantAnimation
            ((QVariantAnimation *)this,(QVariantAnimationPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_006685c8;
  setTargetObject(this,target);
  setPropertyName(this,propertyName);
  return;
}

Assistant:

QPropertyAnimation::QPropertyAnimation(QObject *target, const QByteArray &propertyName, QObject *parent)
    : QVariantAnimation(*new QPropertyAnimationPrivate, parent)
{
    setTargetObject(target);
    setPropertyName(propertyName);
}